

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O0

matrix4d * __thiscall tinyusdz::value::matrix4d::operator=(matrix4d *this,matrix4f *src)

{
  ulong local_28;
  size_t i;
  size_t j;
  matrix4f *src_local;
  matrix4d *this_local;
  
  for (i = 0; i < 4; i = i + 1) {
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      this->m[i][local_28] = (double)src->m[i][local_28];
    }
  }
  return this;
}

Assistant:

matrix4d &matrix4d::operator=(const matrix4f &src) {

  for (size_t j = 0; j < 4; j++) {
    for (size_t i = 0; i < 4; i++) {
      m[j][i] = double(src.m[j][i]);
    }
  }

  return *this;
}